

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie-pfx.c
# Opt level: O0

int pfx_table_src_remove(pfx_table *pfx_table,rtr_socket *socket)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  pfx_table *local_48;
  int rtval;
  trie_node **root;
  uint i;
  rtr_socket *socket_local;
  pfx_table *pfx_table_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  root._4_4_ = 0;
  do {
    if (1 < root._4_4_) {
      pfx_table_local._4_4_ = 0;
LAB_001096e7:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return pfx_table_local._4_4_;
    }
    local_48 = pfx_table;
    if (root._4_4_ != 0) {
      local_48 = (pfx_table *)&pfx_table->ipv6;
    }
    pthread_rwlock_wrlock((pthread_rwlock_t *)&pfx_table->lock);
    if ((local_48->ipv4 != (trie_node *)0x0) &&
       (iVar2 = pfx_table_remove_id(pfx_table,&local_48->ipv4,local_48->ipv4,socket,0), iVar2 == -1)
       ) {
      pthread_rwlock_unlock((pthread_rwlock_t *)&pfx_table->lock);
      pfx_table_local._4_4_ = -1;
      goto LAB_001096e7;
    }
    pthread_rwlock_unlock((pthread_rwlock_t *)&pfx_table->lock);
    root._4_4_ = root._4_4_ + 1;
  } while( true );
}

Assistant:

RTRLIB_EXPORT int pfx_table_src_remove(struct pfx_table *pfx_table, const struct rtr_socket *socket)
{
	for (unsigned int i = 0; i < 2; i++) {
		struct trie_node **root = (i == 0 ? &(pfx_table->ipv4) : &(pfx_table->ipv6));

		pthread_rwlock_wrlock(&(pfx_table->lock));
		if (*root) {
			int rtval = pfx_table_remove_id(pfx_table, root, *root, socket, 0);

			if (rtval == PFX_ERROR) {
				pthread_rwlock_unlock(&pfx_table->lock);
				return PFX_ERROR;
			}
		}
		pthread_rwlock_unlock(&pfx_table->lock);
	}
	return PFX_SUCCESS;
}